

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_copyAssignmentNotEmptyForNotEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>
::TestBody(optTyped_copyAssignmentNotEmptyForNotEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  long *plVar3;
  char *in_R9;
  AssertHelper local_120;
  Message local_118;
  long local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_98;
  Message local_90;
  bool local_81;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_50 [3];
  Message local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  opt_type o2;
  opt_type o1;
  optTyped_copyAssignmentNotEmptyForNotEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
  *this_local;
  
  mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::opt<const_long_&,_true,_true>
            (&o2,&(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).
                  value_1);
  mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::opt<const_long_&,_true,_true>
            ((opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_,
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_2)
  ;
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)o2.storage_;
  testing::AssertionResult::AssertionResult<mp::opt<long,mp::opt_null_value_policy<long,_1l>>>
            ((AssertionResult *)local_30,
             (opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_30,(AssertionResult *)0x20b8e9,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x24d,pcVar2);
    testing::internal::AssertHelper::operator=(local_50,&local_38);
    testing::internal::AssertHelper::~AssertHelper(local_50);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  local_81 = mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::has_value
                       ((opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_80,&local_81,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_80,(AssertionResult *)"o2.has_value()"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x24e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  plVar3 = mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::operator*
                     ((opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_c8,"this->value_1","*o2",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1,
             plVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x24f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  plVar3 = mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>::value
                     ((opt<long,_mp::opt_null_value_policy<long,__1L>_> *)&gtest_ar_.message_);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_e8,"this->value_1","o2.value()",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1,
             plVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x250,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_110 = mp::opt<long,mp::opt_null_value_policy<long,-1l>>::value_or<long_const&>
                        ((opt<long,mp::opt_null_value_policy<long,_1l>> *)&gtest_ar_.message_,
                         &(this->
                          super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).
                          value_2);
  testing::internal::EqHelper<false>::Compare<long,long>
            ((EqHelper<false> *)local_108,"this->value_1","o2.value_or(this->value_2)",
             &(this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).value_1,
             &local_110);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x251,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  return;
}

Assistant:

TYPED_TEST(optTyped, copyAssignmentNotEmptyForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1{this->value_1};
  opt_type o2{this->value_2};
  o2 = o1;
  EXPECT_TRUE(o2);
  EXPECT_TRUE(o2.has_value());
  EXPECT_EQ(this->value_1, *o2);
  EXPECT_EQ(this->value_1, o2.value());
  EXPECT_EQ(this->value_1, o2.value_or(this->value_2));
}